

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O2

int ffgbytoff(fitsfile *fptr,long gsize,long ngroups,long offset,void *buffer,int *status)

{
  LONGLONG *pLVar1;
  int iVar2;
  FITSfile *pFVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  void *__dest;
  long local_60;
  
  iVar2 = *status;
  if (iVar2 < 1) {
    pFVar3 = fptr->Fptr;
    if (fptr->HDUposition != pFVar3->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      pFVar3 = fptr->Fptr;
    }
    iVar2 = pFVar3->curbuf;
    if (iVar2 < 0) {
      ffldrc(fptr,pFVar3->bytepos / 0xb40,0,status);
      pFVar3 = fptr->Fptr;
      iVar2 = pFVar3->curbuf;
    }
    local_60 = pFVar3->bufrecnum[iVar2];
    lVar5 = local_60 * -0xb40 + pFVar3->bytepos;
    uVar6 = 0xb40 - lVar5;
    pcVar9 = pFVar3->iobuffer + lVar5 + iVar2 * 0xb40;
    lVar5 = 1;
    while( true ) {
      uVar4 = gsize;
      if ((long)uVar6 < gsize) {
        uVar4 = uVar6;
      }
      memcpy(buffer,pcVar9,uVar4);
      if (ngroups <= lVar5) break;
      __dest = (void *)((long)buffer + uVar4);
      if ((long)uVar6 < gsize) {
        local_60 = local_60 + 1;
        ffldrc(fptr,local_60,0,status);
        pcVar9 = fptr->Fptr->iobuffer + (long)fptr->Fptr->curbuf * 0xb40;
        memcpy(__dest,pcVar9,gsize - uVar4);
        __dest = (void *)((long)buffer + gsize);
        lVar8 = (gsize - uVar4) + offset;
        pcVar9 = pcVar9 + lVar8;
        uVar6 = 0xb40 - lVar8;
      }
      else {
        pcVar9 = pcVar9 + uVar4 + offset;
        uVar6 = uVar6 - (uVar4 + offset);
      }
      if (uVar6 - 0xb41 < 0xfffffffffffff4c0) {
        if ((long)uVar6 < 1) {
          uVar4 = (0xb40 - uVar6) / 0xb40;
          uVar7 = -uVar6 % 0xb40;
        }
        else {
          uVar4 = -((uVar6 - 1) / 0xb40);
          uVar7 = 0xb40 - uVar6 % 0xb40;
        }
        local_60 = local_60 + uVar4;
        ffldrc(fptr,local_60,0,status);
        uVar6 = 0xb40 - uVar7;
        pcVar9 = fptr->Fptr->iobuffer + uVar7 + (long)fptr->Fptr->curbuf * 0xb40;
      }
      lVar5 = lVar5 + 1;
      buffer = __dest;
    }
    if ((long)uVar6 < gsize) {
      ffldrc(fptr,local_60 + 1,0,status);
      memcpy((void *)((long)buffer + uVar4),fptr->Fptr->iobuffer + (long)fptr->Fptr->curbuf * 0xb40,
             gsize - uVar4);
    }
    pLVar1 = &fptr->Fptr->bytepos;
    *pLVar1 = *pLVar1 + (ngroups + -1) * offset + gsize * ngroups;
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffgbytoff(fitsfile *fptr, /* I - FITS file pointer                   */
           long gsize,        /* I - size of each group of bytes         */
           long ngroups,      /* I - number of groups to read            */
           long offset,       /* I - size of gap between groups (may be < 0) */
           void *buffer,      /* I - buffer to be filled                 */
           int *status)       /* IO - error status                       */
/*
  get (read) the requested number of bytes from the file, starting at
  the current file position.  This function combines ffmbyt and ffgbyt
  for increased efficiency.
*/
{
    int bcurrent;
    long ii, bufpos, nspace, nread, record;
    char *cptr, *ioptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    cptr = (char *)buffer;
    bcurrent = (fptr->Fptr)->curbuf;     /* number of the current IO buffer */
    record = (fptr->Fptr)->bufrecnum[bcurrent];  /* zero-indexed record number */
    bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)record * IOBUFLEN)); /* start pos */
    nspace = IOBUFLEN - bufpos;  /* amount of space left in buffer */
    ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;  

    for (ii = 1; ii < ngroups; ii++)  /* read all but the last group */
    {
      /* copy bytes from IO buffer to the user's buffer */
      nread = minvalue(gsize, nspace);
      memcpy(cptr, ioptr, nread);
      cptr += nread;          /* increment buffer pointer */

      if (nread < gsize)        /* entire group did not fit */
      {
        record++;
        ffldrc(fptr, record, REPORT_EOF, status);  /* load next record */
        bcurrent = (fptr->Fptr)->curbuf;
        ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

        nread  = gsize - nread;
        memcpy(cptr, ioptr, nread);
        cptr   += nread;            /* increment buffer pointer */
        ioptr  += (offset + nread); /* increment IO buffer pointer */
        nspace = IOBUFLEN - offset - nread;  /* amount of space left */
      }
      else
      {
        ioptr  += (offset + nread);  /* increment IO bufer pointer */
        nspace -= (offset + nread);
      }

      if (nspace <= 0 || nspace > IOBUFLEN) /* beyond current record? */
      {
        if (nspace <= 0)
        {
          record += ((IOBUFLEN - nspace) / IOBUFLEN); /* new record number */
          bufpos = (-nspace) % IOBUFLEN; /* starting buffer pos */
        }
        else
        {
          record -= ((nspace - 1 ) / IOBUFLEN); /* new record number */
          bufpos = IOBUFLEN - (nspace % IOBUFLEN); /* starting buffer pos */
        }

        ffldrc(fptr, record, REPORT_EOF, status);
        bcurrent = (fptr->Fptr)->curbuf;

        nspace = IOBUFLEN - bufpos;
        ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;
      }
    }

    /* now read the last group */
    nread = minvalue(gsize, nspace);
    memcpy(cptr, ioptr, nread);
    cptr += nread;          /* increment buffer pointer */

    if (nread < gsize)        /* entire group did not fit */
    {
      record++;
      ffldrc(fptr, record, REPORT_EOF, status);  /* load next record */
      bcurrent = (fptr->Fptr)->curbuf;
      ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

      nread  = gsize - nread;
      memcpy(cptr, ioptr, nread);
    }

    (fptr->Fptr)->bytepos = (fptr->Fptr)->bytepos + (ngroups * gsize)
                                  + (ngroups - 1) * offset;
    return(*status);
}